

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O3

void __thiscall cmStateSnapshot::InitializeFromParent(cmStateSnapshot *this)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  StackIter begin;
  StackIter end;
  PointerType pSVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var3;
  PointerType pBVar4;
  PointerType pBVar5;
  PointerType pBVar6;
  PointerType pBVar7;
  PositionType *this_00;
  PositionType parent;
  iterator local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  this_00 = &this->Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  local_78.Tree = (pSVar2->DirectoryParent).Tree;
  local_78.Position = (pSVar2->DirectoryParent).Position;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar1 = (pSVar2->Vars).Tree;
  if ((pcVar1 == (cmLinkedTree<cmDefinitions> *)0x0) ||
     ((ulong)(((long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) <
      (pSVar2->Vars).Position)) {
    __assert_fail("this->Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x16b,"void cmStateSnapshot::InitializeFromParent()");
  }
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
  pcVar1 = (pSVar2->Vars).Tree;
  if ((pcVar1 != (cmLinkedTree<cmDefinitions> *)0x0) &&
     ((pSVar2->Vars).Position <=
      (ulong)(((long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    begin.Tree = (pSVar2->Vars).Tree;
    begin.Position = (pSVar2->Vars).Position;
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    end.Tree = (pSVar2->Root).Tree;
    end.Position = (pSVar2->Root).Position;
    cmDefinitions::MakeClosure((cmDefinitions *)&local_68,begin,end);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    p_Var3 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)cmLinkedTree<cmDefinitions>::iterator::operator*(&pSVar2->Vars);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(p_Var3,&local_68);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar4->IncludeDirectories,&pBVar5->IncludeDirectories,
               &pBVar6->IncludeDirectoryBacktraces,&pBVar7->IncludeDirectoryBacktraces,
               &pSVar2->IncludeDirectoryPosition);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar4->CompileDefinitions,&pBVar5->CompileDefinitions,
               &pBVar6->CompileDefinitionsBacktraces,&pBVar7->CompileDefinitionsBacktraces,
               &pSVar2->CompileDefinitionsPosition);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar2->BuildSystemDirectory);
    pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar4->CompileOptions,&pBVar5->CompileOptions,&pBVar6->CompileOptionsBacktraces,
               &pBVar7->CompileOptionsBacktraces,&pSVar2->CompileOptionsPosition);
    return;
  }
  __assert_fail("parent->Vars.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmStateSnapshot.cxx"
                ,0x16c,"void cmStateSnapshot::InitializeFromParent()");
}

Assistant:

void cmStateSnapshot::InitializeFromParent()
{
  cmStateDetail::PositionType parent = this->Position->DirectoryParent;
  assert(this->Position->Vars.IsValid());
  assert(parent->Vars.IsValid());

  *this->Position->Vars =
    cmDefinitions::MakeClosure(parent->Vars, parent->Root);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->IncludeDirectories,
    this->Position->BuildSystemDirectory->IncludeDirectories,
    parent->BuildSystemDirectory->IncludeDirectoryBacktraces,
    this->Position->BuildSystemDirectory->IncludeDirectoryBacktraces,
    this->Position->IncludeDirectoryPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileDefinitions,
    this->Position->BuildSystemDirectory->CompileDefinitions,
    parent->BuildSystemDirectory->CompileDefinitionsBacktraces,
    this->Position->BuildSystemDirectory->CompileDefinitionsBacktraces,
    this->Position->CompileDefinitionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileOptions,
    this->Position->BuildSystemDirectory->CompileOptions,
    parent->BuildSystemDirectory->CompileOptionsBacktraces,
    this->Position->BuildSystemDirectory->CompileOptionsBacktraces,
    this->Position->CompileOptionsPosition);
}